

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O0

void fe::operations::SwitchSrcDestT<fe::PixelB8G8R8A8,fe::operations::op_blit_colored>
               (op_blit_colored *op,PixelB8G8R8A8 *s,ImageData *src,ImageData *dest)

{
  PixelDISTANCE local_2c;
  PixelB8G8R8A8 local_2b;
  PixelR8G8B8A8 local_2a;
  PixelA8 local_29;
  PixelDISTANCE d_3;
  PixelB8G8R8A8 d_2;
  PixelR8G8B8A8 d_1;
  ImageData *pIStack_28;
  PixelA8 d;
  ImageData *dest_local;
  ImageData *src_local;
  PixelB8G8R8A8 *s_local;
  op_blit_colored *op_local;
  
  pIStack_28 = dest;
  switch((dest->super_fe_image).format) {
  case FE_IMG_A8:
    applyOperationT<fe::operations::op_blit_colored,fe::PixelB8G8R8A8,fe::PixelA8>
              (op,s,&local_29,src,dest);
    break;
  default:
    __assert_fail("!\"unknown format\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/ImageDataOperations.h"
                  ,0x172,
                  "void fe::operations::SwitchSrcDestT(const Op &, const Src &, const ImageData &, const ImageData &) [Src = fe::PixelB8G8R8A8, Op = fe::operations::op_blit_colored]"
                 );
  case FE_IMG_R8G8B8A8:
    applyOperationT<fe::operations::op_blit_colored,fe::PixelB8G8R8A8,fe::PixelR8G8B8A8>
              (op,s,&local_2a,src,dest);
    break;
  case FE_IMG_B8G8R8A8:
    applyOperationT<fe::operations::op_blit_colored,fe::PixelB8G8R8A8,fe::PixelB8G8R8A8>
              (op,s,&local_2b,src,dest);
    break;
  case FE_IMG_DISTANCE:
    applyOperationT<fe::operations::op_blit_colored,fe::PixelB8G8R8A8,fe::PixelDISTANCE>
              (op,s,&local_2c,src,dest);
  }
  return;
}

Assistant:

void SwitchSrcDestT(const Op& op, const Src& s, const ImageData& src, const ImageData& dest)
        {
#define FORMAT_CASE FORMAT_OP1
            ALL_FORMATS_SWITCH(dest.format);
#undef FORMAT_CASE
        }